

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::~Compaction(Compaction *this)

{
  long lVar1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  Version *in_stack_ffffffffffffffc8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
  *in_stack_ffffffffffffffd8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) != 0) {
    Version::Unref(in_stack_ffffffffffffffc8);
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            (in_stack_ffffffffffffffd8);
  this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
            (in_RDI + 0xc0);
  local_20 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             (in_RDI + 0xf0);
  do {
    local_20 = local_20 + -1;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector(this_00)
    ;
  } while (local_20 != this_00);
  VersionEdit::~VersionEdit((VersionEdit *)in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Compaction::~Compaction() {
  if (input_version_ != nullptr) {
    input_version_->Unref();
  }
}